

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::MessageID::operator<(MessageID *this,MessageID *rhs)

{
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_19;
  MessageID *rhs_local;
  MessageID *this_local;
  
  local_19 = true;
  if (rhs->source <= this->source) {
    local_29 = false;
    if (this->source == rhs->source) {
      local_2a = true;
      if (rhs->type <= this->type) {
        local_2b = false;
        if (this->type == rhs->type) {
          local_2b = this->id < rhs->id;
        }
        local_2a = local_2b;
      }
      local_29 = local_2a;
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

bool operator<  (const MessageID& rhs) const
	{
		return source < rhs.source || (source == rhs.source && (type < rhs.type || (type == rhs.type && id < rhs.id)));
	}